

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O1

void decompressBlockDifferentialWithAlphaC
               (uint block_part1,uint block_part2,uint8 *img,uint8 *alpha,int width,int height,
               int startx,int starty,int channelsRGB)

{
  bool bVar1;
  sbyte sVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint8 *puVar10;
  long lVar11;
  long lVar12;
  byte bVar13;
  byte bVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  uint8 *puVar21;
  uint8 *puVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  long lVar26;
  long lVar27;
  
  lVar12 = (long)channelsRGB;
  puVar22 = img + 3;
  if (lVar12 == 3) {
    puVar22 = alpha;
  }
  uVar18 = block_part1 >> 1;
  uVar24 = block_part1 >> 0x13 & 0x1f;
  uVar3 = (block_part1 >> 0x1b) << 3 | block_part1 >> 0x1d;
  uVar17 = block_part1 >> 0xb & 0x1f;
  uVar4 = block_part1 >> 4 & 0xe;
  uVar19 = block_part2 & 0xffff;
  uVar15 = block_part2 >> 0x10;
  sVar2 = (lVar12 != 3) * '\x02';
  iVar6 = (uVar24 >> 2) + uVar24 * 8;
  iVar7 = (uVar17 >> 2) + uVar17 * 8;
  lVar11 = (long)starty;
  lVar16 = (long)width;
  lVar26 = (long)startx;
  if ((block_part1 & 1) == 0) {
    iVar8 = starty * width + startx;
    puVar10 = img + (lVar11 * lVar16 + (long)startx) * lVar12 + 2;
    bVar13 = 0;
    lVar5 = lVar11 + -1;
    lVar27 = (long)startx;
    iVar20 = iVar8;
    puVar21 = puVar10;
    do {
      do {
        uVar25 = uVar19 >> (bVar13 & 0x1f);
        uVar23 = (uVar25 & 1) + (uVar15 >> (bVar13 & 0x1f) & 1) * 2;
        uVar25 = -((uVar25 | uVar18) & 1) &
                 *(uint *)((long)compressParams[0] +
                          (long)unscramble[uVar23] * 4 + (ulong)(uVar4 << 4));
        iVar9 = uVar3 + uVar25;
        if (0xfe < iVar9) {
          iVar9 = 0xff;
        }
        if (iVar9 < 1) {
          iVar9 = 0;
        }
        puVar10[-2] = (uint8)iVar9;
        iVar9 = iVar6 + uVar25;
        if (0xfe < iVar9) {
          iVar9 = 0xff;
        }
        if (iVar9 < 1) {
          iVar9 = 0;
        }
        puVar10[-1] = (uint8)iVar9;
        iVar9 = uVar25 + iVar7;
        if (0xfe < iVar9) {
          iVar9 = 0xff;
        }
        if (iVar9 < 1) {
          iVar9 = 0;
        }
        *puVar10 = (uint8)iVar9;
        if (((uVar18 & 1) == 0) && (uVar23 == 2)) {
          puVar22[iVar8 << sVar2] = '\0';
          puVar10[-2] = '\0';
          puVar10[-1] = '\0';
          *puVar10 = '\0';
        }
        else {
          puVar22[iVar8 << sVar2] = 0xff;
        }
        lVar5 = lVar5 + 1;
        iVar8 = iVar8 + width;
        puVar10 = puVar10 + lVar12 * lVar16;
        bVar13 = bVar13 + 1;
      } while (lVar5 < starty + 3);
      iVar8 = iVar20 + 1;
      puVar10 = puVar21 + lVar12;
      bVar1 = lVar27 <= lVar26;
      lVar5 = lVar11 + -1;
      lVar27 = lVar27 + 1;
      iVar20 = iVar8;
      puVar21 = puVar10;
    } while (bVar1);
  }
  else {
    iVar8 = starty * width + startx;
    puVar10 = img + (lVar11 * lVar16 + lVar26) * lVar12 + 2;
    lVar5 = lVar11 + -1;
    bVar13 = 0;
    puVar21 = puVar10;
    iVar20 = iVar8;
    do {
      do {
        bVar14 = bVar13;
        uVar25 = uVar19 >> (bVar14 & 0x1f);
        uVar23 = (uVar25 & 1) + (uVar15 >> (bVar14 & 0x1f) & 1) * 2;
        uVar25 = -((uVar25 | uVar18) & 1) &
                 *(uint *)((long)compressParams[0] +
                          (long)unscramble[uVar23] * 4 + (ulong)(uVar4 << 4));
        iVar9 = uVar3 + uVar25;
        if (0xfe < iVar9) {
          iVar9 = 0xff;
        }
        if (iVar9 < 1) {
          iVar9 = 0;
        }
        puVar10[-2] = (uint8)iVar9;
        iVar9 = iVar6 + uVar25;
        if (0xfe < iVar9) {
          iVar9 = 0xff;
        }
        if (iVar9 < 1) {
          iVar9 = 0;
        }
        puVar10[-1] = (uint8)iVar9;
        iVar9 = uVar25 + iVar7;
        if (0xfe < iVar9) {
          iVar9 = 0xff;
        }
        if (iVar9 < 1) {
          iVar9 = 0;
        }
        *puVar10 = (uint8)iVar9;
        if (((uVar18 & 1) == 0) && (uVar23 == 2)) {
          puVar22[iVar8 << sVar2] = '\0';
          puVar10[-2] = '\0';
          puVar10[-1] = '\0';
          *puVar10 = '\0';
        }
        else {
          puVar22[iVar8 << sVar2] = 0xff;
        }
        lVar5 = lVar5 + 1;
        iVar8 = iVar8 + width;
        puVar10 = puVar10 + lVar12 * lVar16;
        bVar13 = bVar14 + 1;
      } while (lVar5 <= lVar11);
      iVar8 = iVar20 + 1;
      puVar10 = puVar21 + lVar12;
      bVar1 = lVar26 < startx + 3;
      lVar5 = lVar11 + -1;
      bVar13 = bVar14 + 3;
      puVar21 = puVar10;
      iVar20 = iVar8;
      lVar26 = lVar26 + 1;
    } while (bVar1);
  }
  uVar3 = ((int)(block_part1 << 5) >> 0x1d) + (block_part1 >> 0x1b);
  uVar24 = uVar24 + ((int)(block_part1 << 0xd) >> 0x1d);
  uVar17 = uVar17 + ((int)(block_part1 << 0x15) >> 0x1d);
  uVar4 = uVar3 * 8 & 0xff | (uVar3 & 0xff) >> 2;
  uVar24 = uVar24 * 8 & 0xff | (uVar24 & 0xff) >> 2;
  uVar3 = uVar17 * 8 & 0xff | (uVar17 & 0xff) >> 2;
  sVar2 = (channelsRGB != 3) * '\x02';
  lVar12 = (long)channelsRGB;
  if ((block_part1 & 1) == 0) {
    iVar7 = starty * width + startx + 2;
    puVar10 = img + (lVar11 * lVar16 + (long)(startx + 2)) * lVar12 + 2;
    bVar13 = 8;
    lVar26 = lVar11 + -1;
    lVar5 = (long)(startx + 2);
    puVar21 = puVar10;
    iVar6 = iVar7;
    do {
      do {
        uVar23 = uVar19 >> (bVar13 & 0x1f);
        uVar17 = (uVar23 & 1) + (uVar15 >> (bVar13 & 0x1f) & 1) * 2;
        uVar23 = -((uVar23 | uVar18) & 1) &
                 *(uint *)((long)compressParams[0] +
                          (long)unscramble[uVar17] * 4 + (ulong)((uVar18 & 0xe) << 4));
        iVar20 = uVar4 + uVar23;
        if (0xfe < iVar20) {
          iVar20 = 0xff;
        }
        if (iVar20 < 1) {
          iVar20 = 0;
        }
        puVar10[-2] = (uint8)iVar20;
        iVar20 = uVar24 + uVar23;
        if (0xfe < iVar20) {
          iVar20 = 0xff;
        }
        if (iVar20 < 1) {
          iVar20 = 0;
        }
        puVar10[-1] = (uint8)iVar20;
        iVar20 = uVar23 + uVar3;
        if (0xfe < iVar20) {
          iVar20 = 0xff;
        }
        if (iVar20 < 1) {
          iVar20 = 0;
        }
        *puVar10 = (uint8)iVar20;
        if (((uVar18 & 1) == 0) && (uVar17 == 2)) {
          puVar22[iVar7 << sVar2] = '\0';
          puVar10[-2] = '\0';
          puVar10[-1] = '\0';
          *puVar10 = '\0';
        }
        else {
          puVar22[iVar7 << sVar2] = 0xff;
        }
        lVar26 = lVar26 + 1;
        iVar7 = iVar7 + width;
        puVar10 = puVar10 + lVar16 * lVar12;
        bVar13 = bVar13 + 1;
      } while (lVar26 < starty + 3);
      iVar7 = iVar6 + 1;
      puVar10 = puVar21 + lVar12;
      bVar1 = lVar5 < startx + 3;
      lVar26 = lVar11 + -1;
      lVar5 = lVar5 + 1;
      puVar21 = puVar10;
      iVar6 = iVar7;
    } while (bVar1);
  }
  else {
    iVar6 = starty + 2;
    lVar26 = (long)iVar6 + -1;
    iVar7 = width * iVar6 + startx;
    puVar10 = img + (iVar6 * lVar16 + (long)startx) * lVar12 + 2;
    lVar11 = lVar26;
    bVar13 = 2;
    puVar21 = puVar10;
    lVar5 = (long)startx;
    iVar6 = iVar7;
    do {
      do {
        bVar14 = bVar13;
        uVar23 = uVar19 >> (bVar14 & 0x1f);
        uVar17 = (uVar23 & 1) + (uVar15 >> (bVar14 & 0x1f) & 1) * 2;
        uVar23 = -((uVar23 | uVar18) & 1) &
                 *(uint *)((long)compressParams[0] +
                          (long)unscramble[uVar17] * 4 + (ulong)((uVar18 & 0xe) << 4));
        iVar20 = uVar4 + uVar23;
        if (0xfe < iVar20) {
          iVar20 = 0xff;
        }
        if (iVar20 < 1) {
          iVar20 = 0;
        }
        puVar10[-2] = (uint8)iVar20;
        iVar20 = uVar24 + uVar23;
        if (0xfe < iVar20) {
          iVar20 = 0xff;
        }
        if (iVar20 < 1) {
          iVar20 = 0;
        }
        puVar10[-1] = (uint8)iVar20;
        iVar20 = uVar23 + uVar3;
        if (0xfe < iVar20) {
          iVar20 = 0xff;
        }
        if (iVar20 < 1) {
          iVar20 = 0;
        }
        *puVar10 = (uint8)iVar20;
        if (((uVar18 & 1) == 0) && (uVar17 == 2)) {
          puVar22[iVar7 << sVar2] = '\0';
          puVar10[-2] = '\0';
          puVar10[-1] = '\0';
          *puVar10 = '\0';
        }
        else {
          puVar22[iVar7 << sVar2] = 0xff;
        }
        lVar11 = lVar11 + 1;
        iVar7 = iVar7 + width;
        puVar10 = puVar10 + lVar16 * lVar12;
        bVar13 = bVar14 + 1;
      } while (lVar11 < starty + 3);
      iVar7 = iVar6 + 1;
      puVar10 = puVar21 + lVar12;
      bVar1 = lVar5 < startx + 3;
      lVar11 = lVar26;
      bVar13 = bVar14 + 3;
      puVar21 = puVar10;
      lVar5 = lVar5 + 1;
      iVar6 = iVar7;
    } while (bVar1);
  }
  return;
}

Assistant:

void decompressBlockDifferentialWithAlphaC(unsigned int block_part1, unsigned int block_part2, uint8* img, uint8* alpha, int width, int height, int startx, int starty, int channelsRGB)
{
	
	uint8 avg_color[3], enc_color1[3], enc_color2[3];
	signed char diff[3];
	int table;
	int index,shift;
	int r,g,b;
	int diffbit;
	int flipbit;
  int channelsA;

  if(channelsRGB == 3)
  {
    // We will decode the alpha data to a separate memory area. 
    channelsA = 1;
  }
  else
  {
    // We will decode the RGB data and the alpha data to the same memory area, 
    // interleaved as RGBA. 
    channelsA = 4;
    alpha = &img[0+3];
  }

	//the diffbit now encodes whether or not the entire alpha channel is 255.
	diffbit = (GETBITSHIGH(block_part1, 1, 33));
 	flipbit = (GETBITSHIGH(block_part1, 1, 32));

	// First decode left part of block.
	enc_color1[0]= GETBITSHIGH(block_part1, 5, 63);
	enc_color1[1]= GETBITSHIGH(block_part1, 5, 55);
	enc_color1[2]= GETBITSHIGH(block_part1, 5, 47);

	// Expand from 5 to 8 bits
	avg_color[0] = (enc_color1[0] <<3) | (enc_color1[0] >> 2);
	avg_color[1] = (enc_color1[1] <<3) | (enc_color1[1] >> 2);
	avg_color[2] = (enc_color1[2] <<3) | (enc_color1[2] >> 2);

	table = GETBITSHIGH(block_part1, 3, 39) << 1;

	unsigned int pixel_indices_MSB, pixel_indices_LSB;
		
	pixel_indices_MSB = GETBITS(block_part2, 16, 31);
	pixel_indices_LSB = GETBITS(block_part2, 16, 15);

	if( (flipbit) == 0 )
	{
		// We should not flip
		shift = 0;
		for(int x=startx; x<startx+2; x++)
		{
			for(int y=starty; y<starty+4; y++)
			{
				index  = ((pixel_indices_MSB >> shift) & 1) << 1;
				index |= ((pixel_indices_LSB >> shift) & 1);
				shift++;
				index=unscramble[index];

				int mod = compressParams[table][index];
				if(diffbit==0&&(index==1||index==2)) 
				{
					mod=0;
				}
				
				r=RED_CHANNEL(img,width,x,y,channelsRGB)  =CLAMP(0,avg_color[0]+mod,255);
				g=GREEN_CHANNEL(img,width,x,y,channelsRGB)=CLAMP(0,avg_color[1]+mod,255);
				b=BLUE_CHANNEL(img,width,x,y,channelsRGB) =CLAMP(0,avg_color[2]+mod,255);
				if(diffbit==0&&index==1) 
				{
					alpha[(y*width+x)*channelsA]=0;
					r=RED_CHANNEL(img,width,x,y,channelsRGB)=0;
					g=GREEN_CHANNEL(img,width,x,y,channelsRGB)=0;
					b=BLUE_CHANNEL(img,width,x,y,channelsRGB)=0;
				}
				else 
				{
					alpha[(y*width+x)*channelsA]=255;
				}

			}
		}
	}
	else
	{
		// We should flip
		shift = 0;
		for(int x=startx; x<startx+4; x++)
		{
			for(int y=starty; y<starty+2; y++)
			{
				index  = ((pixel_indices_MSB >> shift) & 1) << 1;
				index |= ((pixel_indices_LSB >> shift) & 1);
				shift++;
				index=unscramble[index];
				int mod = compressParams[table][index];
				if(diffbit==0&&(index==1||index==2)) 
				{
					mod=0;
				}
				r=RED_CHANNEL(img,width,x,y,channelsRGB)  =CLAMP(0,avg_color[0]+mod,255);
				g=GREEN_CHANNEL(img,width,x,y,channelsRGB)=CLAMP(0,avg_color[1]+mod,255);
				b=BLUE_CHANNEL(img,width,x,y,channelsRGB) =CLAMP(0,avg_color[2]+mod,255);
				if(diffbit==0&&index==1) 
				{
					alpha[(y*width+x)*channelsA]=0;
					r=RED_CHANNEL(img,width,x,y,channelsRGB)=0;
					g=GREEN_CHANNEL(img,width,x,y,channelsRGB)=0;
					b=BLUE_CHANNEL(img,width,x,y,channelsRGB)=0;
				}
				else 
				{
					alpha[(y*width+x)*channelsA]=255;
				}
			}
			shift+=2;
		}
	}
	// Now decode right part of block. 
	diff[0]= GETBITSHIGH(block_part1, 3, 58);
	diff[1]= GETBITSHIGH(block_part1, 3, 50);
	diff[2]= GETBITSHIGH(block_part1, 3, 42);

	// Extend sign bit to entire byte. 
	diff[0] = (diff[0] << 5);
	diff[1] = (diff[1] << 5);
	diff[2] = (diff[2] << 5);
	diff[0] = diff[0] >> 5;
	diff[1] = diff[1] >> 5;
	diff[2] = diff[2] >> 5;

	//  Calculate second color
	enc_color2[0]= enc_color1[0] + diff[0];
	enc_color2[1]= enc_color1[1] + diff[1];
	enc_color2[2]= enc_color1[2] + diff[2];

	// Expand from 5 to 8 bits
	avg_color[0] = (enc_color2[0] <<3) | (enc_color2[0] >> 2);
	avg_color[1] = (enc_color2[1] <<3) | (enc_color2[1] >> 2);
	avg_color[2] = (enc_color2[2] <<3) | (enc_color2[2] >> 2);

	table = GETBITSHIGH(block_part1, 3, 36) << 1;
	pixel_indices_MSB = GETBITS(block_part2, 16, 31);
	pixel_indices_LSB = GETBITS(block_part2, 16, 15);

	if( (flipbit) == 0 )
	{
		// We should not flip
		shift=8;
		for(int x=startx+2; x<startx+4; x++)
		{
			for(int y=starty; y<starty+4; y++)
			{
				index  = ((pixel_indices_MSB >> shift) & 1) << 1;
				index |= ((pixel_indices_LSB >> shift) & 1);
				shift++;
				index=unscramble[index];
				int mod = compressParams[table][index];
				if(diffbit==0&&(index==1||index==2)) 
				{
					mod=0;
				}
				
				r=RED_CHANNEL(img,width,x,y,channelsRGB)  =CLAMP(0,avg_color[0]+mod,255);
				g=GREEN_CHANNEL(img,width,x,y,channelsRGB)=CLAMP(0,avg_color[1]+mod,255);
				b=BLUE_CHANNEL(img,width,x,y,channelsRGB) =CLAMP(0,avg_color[2]+mod,255);
				if(diffbit==0&&index==1) 
				{
					alpha[(y*width+x)*channelsA]=0;
					r=RED_CHANNEL(img,width,x,y,channelsRGB)=0;
					g=GREEN_CHANNEL(img,width,x,y,channelsRGB)=0;
					b=BLUE_CHANNEL(img,width,x,y,channelsRGB)=0;
				}
				else 
				{
					alpha[(y*width+x)*channelsA]=255;
				}
			}
		}
	}
	else
	{
		// We should flip
		shift=2;
		for(int x=startx; x<startx+4; x++)
		{
			for(int y=starty+2; y<starty+4; y++)
			{
				index  = ((pixel_indices_MSB >> shift) & 1) << 1;
				index |= ((pixel_indices_LSB >> shift) & 1);
				shift++;
				index=unscramble[index];
				int mod = compressParams[table][index];
				if(diffbit==0&&(index==1||index==2)) 
				{
					mod=0;
				}
				
				r=RED_CHANNEL(img,width,x,y,channelsRGB)  =CLAMP(0,avg_color[0]+mod,255);
				g=GREEN_CHANNEL(img,width,x,y,channelsRGB)=CLAMP(0,avg_color[1]+mod,255);
				b=BLUE_CHANNEL(img,width,x,y,channelsRGB) =CLAMP(0,avg_color[2]+mod,255);
				if(diffbit==0&&index==1) 
				{
					alpha[(y*width+x)*channelsA]=0;
					r=RED_CHANNEL(img,width,x,y,channelsRGB)=0;
					g=GREEN_CHANNEL(img,width,x,y,channelsRGB)=0;
					b=BLUE_CHANNEL(img,width,x,y,channelsRGB)=0;
				}
				else 
				{
					alpha[(y*width+x)*channelsA]=255;
				}
			}
			shift += 2;
		}
	}
}